

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>&,int&,int&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,
          vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *head,int *tail,int *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_4,int *tail_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_6)

{
  process<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>&>(this,head);
  process<int&,int&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
            (this,tail,tail_1,tail_2,tail_3,tail_4,tail_5,tail_6);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }